

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

ValueType ValueType::FromTypeId(TypeId typeId,bool useVirtual)

{
  Bits *pBVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_a;
  
  if (typeId < TypeIds_Limit) {
    if (useVirtual) {
      pBVar1 = VirtualTypeIdToBits;
    }
    else {
      pBVar1 = TypeIdToBits;
    }
    if (pBVar1[typeId] != 0) {
      ValueType((ValueType *)&local_a.field_0,pBVar1[typeId]);
      return (ValueType)local_a;
    }
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)0x9;
}

Assistant:

ValueType ValueType::FromTypeId(const Js::TypeId typeId, bool useVirtual)
{
    if(typeId < _countof(TypeIdToBits))
    {
        if (useVirtual)
        {
            const Bits bits = VirtualTypeIdToBits[typeId];
            if (!!bits)
                return bits;
        }
        else
        {
            const Bits bits = TypeIdToBits[typeId];
            if (!!bits)
                return bits;
        }
    }
    return Uninitialized;
}